

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_do_ecb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  uVar3 = inl >> 4;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    if (iVar1 == 0) {
      grasshopper_decrypt_block
                ((grasshopper_round_keys_t *)(lVar2 + 0xe8),(grasshopper_w128_t *)in,
                 (grasshopper_w128_t *)out,(grasshopper_w128_t *)(lVar2 + 0x188));
    }
    else {
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)(lVar2 + 0x48),(grasshopper_w128_t *)in,
                 (grasshopper_w128_t *)out,(grasshopper_w128_t *)(lVar2 + 0x188));
    }
    in = (uchar *)((long)in + 0x10);
    out = (uchar *)((long)out + 0x10);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_ecb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    size_t blocks = inl / GRASSHOPPER_BLOCK_SIZE;
    size_t i;

    for (i = 0; i < blocks;
         i++, current_in += GRASSHOPPER_BLOCK_SIZE, current_out +=
         GRASSHOPPER_BLOCK_SIZE) {
        if (encrypting) {
            grasshopper_encrypt_block(&c->encrypt_round_keys,
                                      (grasshopper_w128_t *) current_in,
                                      (grasshopper_w128_t *) current_out,
                                      &c->buffer);
        } else {
            grasshopper_decrypt_block(&c->decrypt_round_keys,
                                      (grasshopper_w128_t *) current_in,
                                      (grasshopper_w128_t *) current_out,
                                      &c->buffer);
        }
    }

    return 1;
}